

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall wabt::TypeChecker::DropTypes(TypeChecker *this,size_t drop_count)

{
  pointer pTVar1;
  Result RVar2;
  Enum EVar3;
  Label *label;
  Label *local_20;
  
  RVar2 = GetLabel(this,0,&local_20);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    pTVar1 = (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
             .super__Vector_impl_data._M_finish;
    if ((ulong)((long)pTVar1 -
                (long)(this->type_stack_).
                      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <
        local_20->type_stack_limit + drop_count) {
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::resize
                (&this->type_stack_,local_20->type_stack_limit);
      EVar3 = local_20->unreachable ^ Error;
    }
    else {
      EVar3 = Ok;
      if (drop_count != 0) {
        (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_finish = pTVar1 + -drop_count;
      }
    }
  }
  return (Result)EVar3;
}

Assistant:

Result TypeChecker::DropTypes(size_t drop_count) {
  Label* label;
  CHECK_RESULT(TopLabel(&label));
  if (label->type_stack_limit + drop_count > type_stack_.size()) {
    ResetTypeStackToLabel(label);
    return label->unreachable ? Result::Ok : Result::Error;
  }
  type_stack_.erase(type_stack_.end() - drop_count, type_stack_.end());
  return Result::Ok;
}